

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

ze_image_format_layout_t to_layout(string *layout)

{
  int iVar1;
  ze_image_format_layout_t zVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)layout);
  if (iVar1 == 0) {
    zVar2 = ZE_IMAGE_FORMAT_LAYOUT_8;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)layout);
    if (iVar1 == 0) {
      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_16;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)layout);
      if (iVar1 == 0) {
        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_32;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)layout);
        if (iVar1 == 0) {
          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_8_8;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)layout);
          if (iVar1 == 0) {
            zVar2 = ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)layout);
            if (iVar1 == 0) {
              zVar2 = ZE_IMAGE_FORMAT_LAYOUT_16_16;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)layout);
              if (iVar1 == 0) {
                zVar2 = ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)layout);
                if (iVar1 == 0) {
                  zVar2 = ZE_IMAGE_FORMAT_LAYOUT_32_32;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)layout);
                  if (iVar1 == 0) {
                    zVar2 = ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)layout);
                    if (iVar1 == 0) {
                      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)layout);
                      if (iVar1 == 0) {
                        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_11_11_10;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)layout);
                        if (iVar1 == 0) {
                          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_5_6_5;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)layout);
                          if (iVar1 == 0) {
                            zVar2 = ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)layout);
                            if (iVar1 == 0) {
                              zVar2 = ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)layout);
                              if (iVar1 == 0) {
                                zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y8;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)layout);
                                if (iVar1 == 0) {
                                  zVar2 = ZE_IMAGE_FORMAT_LAYOUT_NV12;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)layout);
                                  if (iVar1 == 0) {
                                    zVar2 = ZE_IMAGE_FORMAT_LAYOUT_YUYV;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)layout);
                                    if (iVar1 == 0) {
                                      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_VYUY;
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)layout);
                                      if (iVar1 == 0) {
                                        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_YVYU;
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)layout);
                                        if (iVar1 == 0) {
                                          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_UYVY;
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)layout);
                                          if (iVar1 == 0) {
                                            zVar2 = ZE_IMAGE_FORMAT_LAYOUT_AYUV;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)layout);
                                            if (iVar1 == 0) {
                                              zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P010;
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)layout);
                                              if (iVar1 == 0) {
                                                zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y410;
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare
                                                                  ((char *)layout);
                                                if (iVar1 == 0) {
                                                  zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P012;
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)layout);
                                                  if (iVar1 == 0) {
                                                    zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y16;
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)layout);
                                                    if (iVar1 == 0) {
                                                      zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P016;
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)layout);
                                                      if (iVar1 == 0) {
                                                        zVar2 = ZE_IMAGE_FORMAT_LAYOUT_Y216;
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)layout);
                                                        if (iVar1 == 0) {
                                                          zVar2 = ZE_IMAGE_FORMAT_LAYOUT_P216;
                                                        }
                                                        else {
                                                          std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "Unknown ze_image_format_layout_t value: ",0x28);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                             (layout->_M_dataplus)._M_p,
                                                             layout->_M_string_length);
                                                  zVar2 = ~ZE_IMAGE_FORMAT_LAYOUT_8;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return zVar2;
}

Assistant:

ze_image_format_layout_t to_layout(const std::string layout) {
  if (layout == "8") {
    return ZE_IMAGE_FORMAT_LAYOUT_8;
  } else if (layout == "16") {
    return ZE_IMAGE_FORMAT_LAYOUT_16;
  } else if (layout == "32") {
    return ZE_IMAGE_FORMAT_LAYOUT_32;
  } else if (layout == "8_8") {
    return ZE_IMAGE_FORMAT_LAYOUT_8_8;
  } else if (layout == "8_8_8_8") {
    return ZE_IMAGE_FORMAT_LAYOUT_8_8_8_8;
  } else if (layout == "16_16") {
    return ZE_IMAGE_FORMAT_LAYOUT_16_16;
  } else if (layout == "16_16_16_16") {
    return ZE_IMAGE_FORMAT_LAYOUT_16_16_16_16;
  } else if (layout == "32_32") {
    return ZE_IMAGE_FORMAT_LAYOUT_32_32;
  } else if (layout == "32_32_32_32") {
    return ZE_IMAGE_FORMAT_LAYOUT_32_32_32_32;
  } else if (layout == "10_10_10_2") {
    return ZE_IMAGE_FORMAT_LAYOUT_10_10_10_2;
  } else if (layout == "11_11_10") {
    return ZE_IMAGE_FORMAT_LAYOUT_11_11_10;
  } else if (layout == "5_6_5") {
    return ZE_IMAGE_FORMAT_LAYOUT_5_6_5;
  } else if (layout == "5_5_5_1") {
    return ZE_IMAGE_FORMAT_LAYOUT_5_5_5_1;
  } else if (layout == "4_4_4_4") {
    return ZE_IMAGE_FORMAT_LAYOUT_4_4_4_4;
  } else if (layout == "Y8") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y8;
  } else if (layout == "NV12") {
    return ZE_IMAGE_FORMAT_LAYOUT_NV12;
  } else if (layout == "YUYV") {
    return ZE_IMAGE_FORMAT_LAYOUT_YUYV;
  } else if (layout == "VYUY") {
    return ZE_IMAGE_FORMAT_LAYOUT_VYUY;
  } else if (layout == "YVYU") {
    return ZE_IMAGE_FORMAT_LAYOUT_YVYU;
  } else if (layout == "UYVY") {
    return ZE_IMAGE_FORMAT_LAYOUT_UYVY;
  } else if (layout == "AYUV") {
    return ZE_IMAGE_FORMAT_LAYOUT_AYUV;
  } else if (layout == "P010") {
    return ZE_IMAGE_FORMAT_LAYOUT_P010;
  } else if (layout == "Y410") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y410;
  } else if (layout == "P012") {
    return ZE_IMAGE_FORMAT_LAYOUT_P012;
  } else if (layout == "Y16") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y16;
  } else if (layout == "P016") {
    return ZE_IMAGE_FORMAT_LAYOUT_P016;
  } else if (layout == "Y216") {
    return ZE_IMAGE_FORMAT_LAYOUT_Y216;
  } else if (layout == "P216") {
    return ZE_IMAGE_FORMAT_LAYOUT_P216;
  } else {
    std::cout << "Unknown ze_image_format_layout_t value: " << layout;
    return static_cast<ze_image_format_layout_t>(-1);
  }
}